

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::read_ktx(mipmapped_texture *this,data_stream_serializer *serializer)

{
  dynamic_string *this_00;
  uint uVar1;
  void *p;
  color_quad<unsigned_char,_int> *pcVar2;
  element *p_00;
  bool bVar3;
  bool bVar4;
  char cVar5;
  component_flags cVar6;
  int iVar7;
  ulong uVar8;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_01;
  uchar *p_01;
  ulong extraout_RAX;
  dxt_image *this_02;
  undefined7 extraout_var;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  pixel_format pVar9;
  char *ctx;
  long lVar10;
  char *ctx_00;
  byte bVar11;
  uint uVar12;
  orientation_flags_t oVar13;
  vector<crnlib::mip_level_*> *pvVar15;
  ulong uVar16;
  uint uVar17;
  char *ctx_01;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  uint x;
  uint uVar21;
  mipmapped_texture *pmVar22;
  uint y;
  vector<unsigned_char> *pvVar23;
  color_quad_u8 c;
  dynamic_string orient;
  dynamic_string crnlib_fourcc_str;
  pixel_packer unpacker;
  ktx_texture kt;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_17c;
  ulong local_178;
  uint local_16c;
  mipmapped_texture *local_168;
  face_vec *local_160;
  ulong local_158;
  uint local_14c;
  orientation_flags_t local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  ulong local_138;
  mip_level *local_130;
  dynamic_string local_128;
  dynamic_string local_118;
  pixel_packer local_108;
  dynamic_string *local_c0;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  ktx_texture local_a0;
  orientation_flags_t oVar14;
  
  clear(this);
  this_00 = &this->m_last_error;
  local_168 = this;
  dynamic_string::set(this_00,"Unable to read KTX file",0xffffffff);
  ktx_texture::ktx_texture(&local_a0);
  bVar3 = ktx_texture::read_from_stream(&local_a0,serializer);
  pmVar22 = local_168;
  if (!bVar3) {
LAB_0012fb46:
    bVar11 = 0;
    goto LAB_0012fb48;
  }
  if ((1 < local_a0.m_header.m_pixelDepth) || (1 < local_a0.m_header.m_numberOfArrayElements)) {
    dynamic_string::set(this_00,"read_ktx: Depth and array textures are not supported",0xffffffff);
    goto LAB_0012fb46;
  }
  local_168->m_width = local_a0.m_header.m_pixelWidth;
  local_168->m_height = local_a0.m_header.m_pixelHeight + (local_a0.m_header.m_pixelHeight == 0);
  uVar19 = local_a0.m_header.m_numberOfMipmapLevels +
           (local_a0.m_header.m_numberOfMipmapLevels == 0);
  local_178 = (ulong)local_a0.m_header.m_numberOfFaces;
  local_118.m_buf_size = 0;
  local_118.m_len = 0;
  local_118.m_pStr = (char *)0x0;
  bVar3 = ktx_texture::get_key_value_as_string(&local_a0,"CRNLIB_FOURCC",&local_118);
  pVar9 = PIXEL_FMT_INVALID;
  if (bVar3 && local_118.m_len == 4) {
    pcVar18 = "";
    if (local_118.m_pStr != (char *)0x0) {
      pcVar18 = local_118.m_pStr;
    }
    pVar9 = PIXEL_FMT_INVALID;
    lVar10 = 4;
    do {
      pVar9 = pVar9 << 8 | (int)pcVar18[lVar10 + -1];
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  local_108.m_comp_max[2] = 0;
  local_108.m_comp_max[3] = 0;
  local_108.m_rgb_is_luma = false;
  local_108._57_3_ = 0;
  local_108.m_comp_ofs[2] = 0;
  local_108.m_comp_ofs[3] = 0;
  local_108.m_comp_max[0] = 0;
  local_108.m_comp_max[1] = 0;
  local_108.m_comp_size[2] = 0;
  local_108.m_comp_size[3] = 0;
  local_108.m_comp_ofs[0] = 0;
  local_108.m_comp_ofs[1] = 0;
  local_108.m_pixel_stride = 0;
  local_108.m_num_comps = 0;
  local_108.m_comp_size[0] = 0;
  local_108.m_comp_size[1] = 0;
  local_13c = local_a0.m_block_dim;
  if (1 < local_a0.m_block_dim) {
    if ((int)local_a0.m_header.m_glInternalFormat < 0x8c4c) {
      uVar17 = local_a0.m_header.m_glInternalFormat - 0x83a0;
      if (uVar17 < 6) {
        if ((3U >> (uVar17 & 0x1f) & 1) == 0) {
          if ((0xcU >> (uVar17 & 0x1f) & 1) == 0) goto switchD_0012fe17_caseD_83f3;
switchD_0012fe17_caseD_83f2:
          uVar17 = 2;
        }
        else {
switchD_0012fe17_caseD_83f0:
          uVar17 = 0;
        }
      }
      else {
        switch(local_a0.m_header.m_glInternalFormat) {
        case 0x83f0:
          goto switchD_0012fe17_caseD_83f0;
        case 0x83f1:
switchD_0012fe17_caseD_83f1:
          uVar17 = 1;
          break;
        case 0x83f2:
          goto switchD_0012fe17_caseD_83f2;
        case 0x83f3:
switchD_0012fe17_caseD_83f3:
          uVar17 = 3;
          break;
        default:
          goto switchD_0012fe17_default;
        }
      }
    }
    else if ((int)local_a0.m_header.m_glInternalFormat < 0x8d64) {
      switch(local_a0.m_header.m_glInternalFormat) {
      case 0x8c4c:
        goto switchD_0012fe17_caseD_83f0;
      case 0x8c4d:
        goto switchD_0012fe17_caseD_83f1;
      case 0x8c4e:
        goto switchD_0012fe17_caseD_83f2;
      case 0x8c4f:
        goto switchD_0012fe17_caseD_83f3;
      default:
        if (local_a0.m_header.m_glInternalFormat != 0x8c70) goto switchD_0012fe17_default;
        uVar17 = 4;
      }
    }
    else {
      if (0x9273 < (int)local_a0.m_header.m_glInternalFormat) {
        if (local_a0.m_header.m_glInternalFormat == 0x9274) {
          uVar17 = 8;
          goto LAB_0012ff2f;
        }
        if (local_a0.m_header.m_glInternalFormat == 0x9278) {
          uVar17 = 9;
          goto LAB_0012ff2f;
        }
switchD_0012fe17_default:
        dynamic_string::set(this_00,"Unsupported KTX internal format",0xffffffff);
        goto LAB_0012ffc0;
      }
      uVar17 = 7;
      if (local_a0.m_header.m_glInternalFormat != 0x8d64) {
        if (local_a0.m_header.m_glInternalFormat != 0x8dbe) goto switchD_0012fe17_default;
        uVar17 = (pVar9 != PIXEL_FMT_DXN) + 5;
      }
    }
LAB_0012ff2f:
    pmVar22->m_format =
         *(pixel_format *)
          (
          "DXT1DX1ADXT3DXT5ATI1A2XYATI2ETC1ETC2ET2AET1SE2ASDXT1DX1ADXT3DXT5ATI1A2XYATI2ETC1ETC2ET2A"
          + (ulong)uVar17 * 4 + 0x30);
    if ((int)pVar9 < 0x52784778) {
      if ((pVar9 == PIXEL_FMT_DXT5_AGBR) || (pVar9 == PIXEL_FMT_DXT5_xGBR)) {
LAB_0012ff70:
        if (uVar17 == 3) {
          pmVar22->m_format = pVar9;
          uVar17 = 3;
        }
      }
    }
    else if ((pVar9 == PIXEL_FMT_DXT5_CCxY) || (pVar9 == PIXEL_FMT_DXT5_xGxR)) goto LAB_0012ff70;
    goto LAB_00130105;
  }
  pmVar22->m_format = PIXEL_FMT_A8R8G8B8;
  get_ogl_type_size(local_a0.m_header.m_glType);
  bVar3 = is_packed_pixel_ogl_type(local_a0.m_header.m_glType);
  if (!bVar3) {
    ctx_01 = "RGBA";
    ctx_00 = "RG";
    ctx = "R";
    pcVar18 = "Unsupported KTX pixel format";
    if (0x8226 < (int)local_a0.m_header.m_glFormat) {
      if ((int)local_a0.m_header.m_glFormat < 0x8d94) {
        uVar17 = local_a0.m_header.m_glFormat - 0x8227;
        if (uVar17 < 0xc) {
          if ((0x13U >> (uVar17 & 0x1f) & 1) != 0) goto switchD_0012ff0e_caseD_2;
          if ((0x804U >> (uVar17 & 0x1f) & 1) != 0) goto switchD_0012fd33_caseD_1903;
        }
        if (local_a0.m_header.m_glFormat - 0x8c40 < 2) goto switchD_0012fd33_caseD_1907;
        if (local_a0.m_header.m_glFormat - 0x8c42 < 2) goto switchD_0012fd33_caseD_1908;
switchD_0012ff0e_default:
        dynamic_string::set(this_00,pcVar18,0xffffffff);
LAB_0012ffc0:
        bVar11 = 0;
        goto LAB_0013070c;
      }
      switch(local_a0.m_header.m_glFormat) {
      case 0x8d94:
        break;
      case 0x8d95:
        goto switchD_0012fd33_caseD_1904;
      case 0x8d96:
        goto switchD_0012fd33_caseD_1905;
      default:
        goto switchD_0012ff0e_default;
      case 0x8d98:
        goto switchD_0012fd33_caseD_1907;
      case 0x8d99:
        goto switchD_0012fd33_caseD_1908;
      case 0x8d9a:
switchD_0012fe87_caseD_8d9a:
        ctx = "BGR";
        break;
      case 0x8d9b:
switchD_0012fe87_caseD_8d9b:
        ctx_01 = "BGRA";
        goto switchD_0012fd33_caseD_1908;
      }
      goto switchD_0012fd33_caseD_1903;
    }
    if (0x8050 < (int)local_a0.m_header.m_glFormat) {
      if ((int)local_a0.m_header.m_glFormat < 0x80e0) {
        if (local_a0.m_header.m_glFormat == 0x8051) goto switchD_0012fd33_caseD_1907;
        if (local_a0.m_header.m_glFormat == 0x8058) goto switchD_0012fd33_caseD_1908;
      }
      else {
        if (local_a0.m_header.m_glFormat == 0x80e0) goto switchD_0012fe87_caseD_8d9a;
        if (local_a0.m_header.m_glFormat == 0x80e1) goto switchD_0012fe87_caseD_8d9b;
      }
      goto switchD_0012ff0e_default;
    }
    switch(local_a0.m_header.m_glFormat) {
    case 0x1903:
      break;
    case 0x1904:
switchD_0012fd33_caseD_1904:
      ctx = "G";
      break;
    case 0x1905:
switchD_0012fd33_caseD_1905:
      ctx = "B";
      break;
    case 0x1906:
      pVar9 = PIXEL_FMT_A8;
      pixel_packer::init(&local_108,(EVP_PKEY_CTX *)0x1a5a89);
      goto LAB_001300df;
    case 0x1907:
switchD_0012fd33_caseD_1907:
      ctx = "RGB";
      break;
    case 0x1908:
      goto switchD_0012fd33_caseD_1908;
    case 0x1909:
      pVar9 = PIXEL_FMT_L8;
      pixel_packer::init(&local_108,(EVP_PKEY_CTX *)0x1a5a9b);
      goto LAB_001300df;
    case 0x190a:
      ctx_00 = "YA";
switchD_0012ff0e_caseD_2:
      pVar9 = PIXEL_FMT_A8L8;
      pixel_packer::init(&local_108,(EVP_PKEY_CTX *)ctx_00);
      goto LAB_001300df;
    default:
      switch(local_a0.m_header.m_glFormat) {
      case 1:
        break;
      case 2:
        goto switchD_0012ff0e_caseD_2;
      case 3:
        goto switchD_0012fd33_caseD_1907;
      case 4:
        goto switchD_0012fd33_caseD_1908;
      default:
        goto switchD_0012ff0e_default;
      }
    }
switchD_0012fd33_caseD_1903:
    pVar9 = PIXEL_FMT_R8G8B8;
    pixel_packer::init(&local_108,(EVP_PKEY_CTX *)ctx);
LAB_001300df:
    pmVar22->m_format = pVar9;
LAB_001300e3:
    uVar20 = local_108.m_num_comps;
    uVar21 = get_ogl_type_size(local_a0.m_header.m_glType);
    uVar21 = uVar21 * uVar20;
    goto LAB_001300f9;
  }
  switch(local_a0.m_header.m_glType) {
  case 0x8362:
    pcVar18 = "R3G3B2";
    goto LAB_0012fff2;
  case 0x8363:
    pcVar18 = "B5G6R5";
    goto LAB_0012fff2;
  case 0x8364:
    pcVar18 = "R5G6B5";
LAB_0012fff2:
    pixel_packer::init(&local_108,(EVP_PKEY_CTX *)pcVar18);
    pmVar22->m_format = PIXEL_FMT_R8G8B8;
    goto LAB_0013004c;
  case 0x8365:
    pcVar18 = "R4G4B4A4";
    break;
  case 0x8366:
    pcVar18 = "R5G5B5A1";
    break;
  case 0x8367:
    pcVar18 = "R8G8B8A8";
    break;
  case 0x8368:
    pcVar18 = "R10G10B10A2";
    break;
  default:
    switch(local_a0.m_header.m_glType) {
    case 0x8032:
      pcVar18 = "B2G3R3";
      goto LAB_0012fff2;
    case 0x8033:
      pcVar18 = "A4B4G4R4";
      break;
    case 0x8034:
      pcVar18 = "A1B5G5R5";
      break;
    case 0x8035:
      pcVar18 = "A8B8G8R8";
      break;
    case 0x8036:
      pcVar18 = "A2B10G10R10";
      break;
    default:
      if (local_a0.m_header.m_glType != 0x8c3e) {
        pcVar18 = "Unsupported KTX packed pixel type";
        goto switchD_0012ff0e_default;
      }
      pcVar18 = "R9G9B9A5";
    }
  }
  pixel_packer::init(&local_108,(EVP_PKEY_CTX *)pcVar18);
LAB_0013004c:
  uVar21 = get_ogl_type_size(local_a0.m_header.m_glType);
LAB_001300f9:
  local_108.m_pixel_stride = uVar21;
  uVar17 = 0xffffffff;
LAB_00130105:
  cVar6 = pixel_format_helpers::get_component_flags(pmVar22->m_format);
  uVar16 = local_178;
  pmVar22->m_comp_flags = cVar6;
  local_160 = &pmVar22->m_faces;
  uVar1 = (pmVar22->m_faces).m_size;
  uVar12 = uVar1 - (uint)local_178;
  if (uVar12 != 0) {
    if (uVar1 < (uint)local_178 || uVar12 == 0) {
      if ((pmVar22->m_faces).m_capacity < (uint)local_178) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_160,(uint)local_178,uVar1 + 1 == (uint)local_178,0x10,
                   (object_mover)0x0,false);
      }
      uVar1 = (pmVar22->m_faces).m_size;
      if ((uint)local_178 != uVar1) {
        memset(local_160->m_p + uVar1,0,(ulong)((uint)local_178 - uVar1) << 4);
      }
    }
    else {
      pvVar15 = local_160->m_p;
      lVar10 = 0;
      do {
        p = *(void **)((long)&pvVar15[uVar16].m_p + lVar10);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar10 = lVar10 + 0x10;
      } while ((ulong)uVar12 << 4 != lVar10);
    }
    (local_168->m_faces).m_size = (uint)local_178;
  }
  local_128.m_buf_size = 0;
  local_128.m_len = 0;
  local_128.m_pStr = (char *)0x0;
  bVar4 = ktx_texture::get_key_value_as_string(&local_a0,"KTXorientation",&local_128);
  oVar13 = cDefaultOrientationFlags;
  oVar14 = cDefaultOrientationFlags;
  bVar3 = true;
  local_c0 = this_00;
  if (bVar4 && 6 < local_128.m_len) {
    pcVar18 = "";
    if (local_128.m_pStr != (char *)0x0) {
      pcVar18 = local_128.m_pStr;
    }
    if ((((*pcVar18 == 'S') && (pcVar18[1] == '=')) && (oVar13 = oVar14, pcVar18[3] == ',')) &&
       ((pcVar18[4] == 'T' && (pcVar18[5] == '=')))) {
      iVar7 = tolower((int)pcVar18[2]);
      oVar13 = (orientation_flags_t)(iVar7 == 0x6c);
      iVar7 = tolower((int)pcVar18[6]);
      bVar3 = iVar7 != 100;
    }
  }
  local_148 = oVar13 + cOrientationFlagYFlipped;
  if (!bVar3) {
    local_148 = oVar13;
  }
  bVar3 = (uint)local_178 == 0;
  if (bVar3) {
    local_16c = 0;
    uVar19 = (uint)bVar3;
  }
  else {
    local_14c = (uint)bVar3;
    local_b8 = (ulong)uVar19;
    uVar16 = 0;
    local_16c = 0;
    local_144 = uVar19;
    local_140 = uVar17;
    do {
      uVar17 = local_144;
      pmVar22 = local_168;
      local_b0 = uVar16 * 0x10;
      uVar19 = local_160->m_p[uVar16].m_size;
      pvVar15 = local_160->m_p + uVar16;
      local_138 = uVar16;
      if (uVar19 != local_144) {
        if (uVar19 <= local_144) {
          if (pvVar15->m_capacity < local_144) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)pvVar15,local_144,uVar19 + 1 == local_144,8,
                       (object_mover)0x0,false);
          }
          memset(pvVar15->m_p + pvVar15->m_size,0,(ulong)(uVar17 - pvVar15->m_size) << 3);
        }
        pvVar15->m_size = uVar17;
      }
      bVar3 = true;
      uVar16 = 0;
      do {
        uVar19 = pmVar22->m_width >> ((byte)uVar16 & 0x1f);
        uVar20 = uVar19 + (uVar19 == 0);
        uVar19 = pmVar22->m_height >> ((byte)uVar16 & 0x1f);
        local_158 = (ulong)(uVar19 + (uVar19 == 0));
        local_130 = (mip_level *)crnlib_malloc(0x28);
        local_130->m_width = 0;
        local_130->m_height = 0;
        local_130->m_comp_flags = cDefaultCompFlags;
        *(undefined8 *)&local_130->m_format = 0;
        *(undefined8 *)((long)&local_130->m_pImage + 4) = 0;
        *(undefined8 *)((long)&local_130->m_pDXTImage + 4) = 0;
        *(mip_level **)(*(long *)((long)&local_160->m_p->m_p + local_b0) + uVar16 * 8) = local_130;
        pvVar23 = local_a0.m_image_data.m_p +
                  (local_a0.m_header.m_numberOfFaces * (int)uVar16 *
                   (local_a0.m_header.m_numberOfArrayElements +
                   (local_a0.m_header.m_numberOfArrayElements == 0)) + (int)local_138) *
                  (local_a0.m_header.m_pixelDepth + (local_a0.m_header.m_pixelDepth == 0));
        local_a8 = uVar16;
        if (local_13c < 2) {
          uVar19 = (int)local_158 * uVar20 * local_108.m_pixel_stride;
          uVar8 = (ulong)uVar19;
          if (pvVar23->m_size != uVar19) goto LAB_00130653;
          this_01 = (image<crnlib::color_quad<unsigned_char,_int>_> *)crnlib_malloc(0x30);
          local_17c.m_u32 = 0xff000000;
          image<crnlib::color_quad<unsigned_char,_int>_>::image
                    (this_01,uVar20,(uint)local_158,0xffffffff,
                     (color_quad<unsigned_char,_int> *)&local_17c.field_0,0xf);
          this_01->m_comp_flags = pmVar22->m_comp_flags;
          p_01 = pvVar23->m_p;
          iVar7 = 0;
          do {
            uVar21 = 0;
            do {
              p_01 = (uchar *)pixel_packer::unpack<crnlib::color_quad<unsigned_char,int>>
                                        (&local_108,p_01,
                                         (color_quad<unsigned_char,_int> *)&local_17c.field_0,true);
              pcVar2 = this_01->m_pPixels;
              uVar19 = this_01->m_pitch * iVar7 + uVar21;
              pcVar2[uVar19].field_0.field_0.r = local_17c.field_0.r;
              pcVar2[uVar19].field_0.field_0.g = local_17c.field_0.g;
              pcVar2[uVar19].field_0.field_0.b = local_17c.field_0.b;
              pcVar2[uVar19].field_0.field_0.a = local_17c.field_0.a;
              uVar21 = uVar21 + 1;
            } while (uVar20 != uVar21);
            iVar7 = iVar7 + 1;
          } while (iVar7 != (int)local_158);
          cVar5 = '\x01';
          mip_level::assign(local_130,this_01,local_168->m_format,local_148);
          uVar8 = extraout_RAX;
        }
        else {
          pVar9 = pmVar22->m_format;
          uVar8 = 8;
          if (0x41315843 < (int)pVar9) {
            if ((int)pVar9 < 0x52784778) {
              if ((int)pVar9 < 0x52424741) {
                if (pVar9 == PIXEL_FMT_DXT1A) goto LAB_001305b7;
                if (pVar9 == PIXEL_FMT_ETC2A) goto LAB_001305b2;
              }
              else if ((pVar9 == PIXEL_FMT_DXT5_AGBR) || (pVar9 == PIXEL_FMT_DXT5_xGBR))
              goto LAB_001305b2;
            }
            else if ((int)pVar9 < 0x53413245) {
              if (pVar9 == PIXEL_FMT_DXT5_xGxR) goto LAB_001305b2;
              if (pVar9 == PIXEL_FMT_ETC1S) goto LAB_001305b7;
            }
            else if (((pVar9 == PIXEL_FMT_ETC2AS) || (pVar9 == PIXEL_FMT_DXN)) ||
                    (pVar9 == PIXEL_FMT_DXT5_CCxY)) goto LAB_001305b2;
            goto LAB_001305ae;
          }
          if ((int)pVar9 < 0x32495441) {
            if ((int)pVar9 < 0x31545844) {
              if ((pVar9 != PIXEL_FMT_ETC1) && (pVar9 != PIXEL_FMT_DXT5A)) goto LAB_001305ae;
            }
            else if ((pVar9 != PIXEL_FMT_DXT1) && (pVar9 != PIXEL_FMT_ETC2)) goto LAB_001305ae;
          }
          else {
            if ((int)pVar9 < 0x33545844) {
              if ((pVar9 == PIXEL_FMT_3DC) || (pVar9 == PIXEL_FMT_DXT2)) goto LAB_001305b2;
            }
            else if ((pVar9 == PIXEL_FMT_DXT3) ||
                    ((pVar9 == PIXEL_FMT_DXT4 || (pVar9 == PIXEL_FMT_DXT5)))) {
LAB_001305b2:
              uVar8 = 0x10;
              goto LAB_001305b7;
            }
LAB_001305ae:
            uVar8 = 0;
          }
LAB_001305b7:
          if (pvVar23->m_size == ((int)local_158 + 3U >> 2) * (uVar20 + 3 >> 2) * (int)uVar8) {
            this_02 = (dxt_image *)crnlib_malloc(0x48);
            dxt_image::dxt_image(this_02);
            iVar7 = dxt_image::init(this_02,(EVP_PKEY_CTX *)(ulong)local_140);
            p_00 = (this_02->m_elements).m_p;
            cVar5 = (char)iVar7;
            if (cVar5 == '\0') {
              if (p_00 != (element *)0x0) {
                crnlib_free(p_00);
              }
              crnlib_free(this_02);
              uVar8 = extraout_RAX_01;
            }
            else {
              memcpy(p_00,pvVar23->m_p,(ulong)pvVar23->m_size);
              if ((local_168->m_format == PIXEL_FMT_DXT1) && ((local_16c & 1) == 0)) {
                bVar4 = dxt_image::has_alpha(this_02);
                local_16c = (uint)CONCAT71(extraout_var,bVar4);
              }
              mip_level::assign(local_130,this_02,local_168->m_format,local_148);
              uVar8 = extraout_RAX_00;
            }
          }
          else {
LAB_00130653:
            cVar5 = '\0';
          }
        }
        if (cVar5 == '\0') break;
        uVar16 = local_a8 + 1;
        bVar3 = uVar16 < local_b8;
        pmVar22 = local_168;
      } while (uVar16 != local_b8);
      uVar19 = local_14c;
      if (bVar3) break;
      uVar16 = local_138 + 1;
      local_14c = (uint)CONCAT71((int7)(uVar8 >> 8),local_178 <= uVar16);
      uVar19 = local_14c;
    } while (uVar16 != local_178);
  }
  pmVar22 = local_168;
  bVar11 = (byte)uVar19;
  if (((uVar19 & 1) != 0) && (dynamic_string::clear(local_c0), (local_16c & 1) != 0)) {
    change_dxt1_to_dxt1a(pmVar22);
  }
  if ((local_128.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_128.m_pStr + -8) ^ *(uint *)(local_128.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_128.m_pStr + -0x10);
  }
LAB_0013070c:
  if ((local_118.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_118.m_pStr + -8) ^ *(uint *)(local_118.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_118.m_pStr + -0x10);
  }
LAB_0012fb48:
  ktx_texture::~ktx_texture(&local_a0);
  return (bool)(bVar11 & 1);
switchD_0012fd33_caseD_1908:
  pixel_packer::init(&local_108,(EVP_PKEY_CTX *)ctx_01);
  goto LAB_001300e3;
}

Assistant:

bool mipmapped_texture::read_ktx(data_stream_serializer& serializer) {
  clear();

  set_last_error("Unable to read KTX file");

  ktx_texture kt;
  if (!kt.read_from_stream(serializer))
    return false;

  if ((kt.get_depth() > 1) || (kt.get_array_size() > 1)) {
    set_last_error("read_ktx: Depth and array textures are not supported");
    return false;
  }

  // Must be 1D, 2D, or a cubemap, with or without mipmaps.
  m_width = kt.get_width();
  m_height = kt.get_height();

  uint num_mip_levels = kt.get_num_mips();
  uint num_faces = kt.get_num_faces();

  uint32 crnlib_fourcc = 0;
  dynamic_string crnlib_fourcc_str;
  if (kt.get_key_value_as_string("CRNLIB_FOURCC", crnlib_fourcc_str)) {
    if (crnlib_fourcc_str.get_len() == 4) {
      for (int i = 3; i >= 0; i--)
        crnlib_fourcc = (crnlib_fourcc << 8) | crnlib_fourcc_str[i];
    }
  }

  const bool is_compressed_texture = kt.is_compressed();
  dxt_format dxt_fmt = cDXTInvalid;

  pixel_packer unpacker;
  if (is_compressed_texture) {
    switch (kt.get_ogl_internal_fmt()) {
      case KTX_ETC1_RGB8_OES:
        dxt_fmt = cETC1;
        break;
      case KTX_COMPRESSED_RGB8_ETC2:
        dxt_fmt = cETC2;
        break;
      case KTX_COMPRESSED_RGBA8_ETC2_EAC:
        dxt_fmt = cETC2A;
        break;
      case KTX_RGB_S3TC:
      case KTX_RGB4_S3TC:
      case KTX_COMPRESSED_RGB_S3TC_DXT1_EXT:
      case KTX_COMPRESSED_SRGB_S3TC_DXT1_EXT:
        dxt_fmt = cDXT1;
        break;
      case KTX_COMPRESSED_RGBA_S3TC_DXT1_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT1_EXT:
        dxt_fmt = cDXT1A;
        break;
      case KTX_RGBA_S3TC:
      case KTX_RGBA4_S3TC:
      case KTX_COMPRESSED_RGBA_S3TC_DXT3_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT3_EXT:
        dxt_fmt = cDXT3;
        break;
      case KTX_COMPRESSED_RGBA_S3TC_DXT5_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT5_EXT:
      case KTX_RGBA_DXT5_S3TC:
      case KTX_RGBA4_DXT5_S3TC:
        dxt_fmt = cDXT5;
        break;
      case KTX_COMPRESSED_SIGNED_RED_GREEN_RGTC2_EXT:
        dxt_fmt = cDXN_YX;
        if (crnlib_fourcc == PIXEL_FMT_DXN) {
          dxt_fmt = cDXN_XY;
        }
        break;
      case KTX_COMPRESSED_LUMINANCE_LATC1_EXT:
        dxt_fmt = cDXT5A;
        break;
      default:
        set_last_error("Unsupported KTX internal format");
        return false;
    }

    m_format = pixel_format_helpers::from_dxt_format(dxt_fmt);
    if (m_format == PIXEL_FMT_INVALID) {
      set_last_error("Unsupported KTX internal compressed format");
      return false;
    }

    if (crnlib_fourcc != 0) {
      switch (crnlib_fourcc) {
        case PIXEL_FMT_DXT5_CCxY:
        case PIXEL_FMT_DXT5_xGxR:
        case PIXEL_FMT_DXT5_xGBR:
        case PIXEL_FMT_DXT5_AGBR: {
          if (dxt_fmt == cDXT5) {
            m_format = static_cast<pixel_format>(crnlib_fourcc);
          }
          break;
        }
      }
    }
  } else {
    m_format = PIXEL_FMT_A8R8G8B8;
    const uint type_size = get_ogl_type_size(kt.get_ogl_type());
    const uint type_bits = type_size * 8;

    // Normal component order:   1,2,3,4 (*last* component packed into LSB of output type)
    // Reversed component order: 4,3,2,1 (*first* component packed into LSB of output type)

    if (is_packed_pixel_ogl_type(kt.get_ogl_type())) {
      switch (kt.get_ogl_type()) {
        // 24bpp packed formats
        case KTX_UNSIGNED_BYTE_3_3_2:
          unpacker.init("B2G3R3");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_BYTE_2_3_3_REV:
          unpacker.init("R3G3B2");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_SHORT_5_6_5:
          unpacker.init("B5G6R5");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_SHORT_5_6_5_REV:
          unpacker.init("R5G6B5");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        // 32bpp packed formats
        case KTX_UNSIGNED_SHORT_4_4_4_4:
          unpacker.init("A4B4G4R4");
          break;
        case KTX_UNSIGNED_SHORT_4_4_4_4_REV:
          unpacker.init("R4G4B4A4");
          break;
        case KTX_UNSIGNED_SHORT_5_5_5_1:
          unpacker.init("A1B5G5R5");
          break;
        case KTX_UNSIGNED_SHORT_1_5_5_5_REV:
          unpacker.init("R5G5B5A1");
          break;
        case KTX_UNSIGNED_INT_8_8_8_8:
          unpacker.init("A8B8G8R8");
          break;
        case KTX_UNSIGNED_INT_8_8_8_8_REV:
          unpacker.init("R8G8B8A8");
          break;
        case KTX_UNSIGNED_INT_10_10_10_2:
          unpacker.init("A2B10G10R10");
          break;
        case KTX_UNSIGNED_INT_2_10_10_10_REV:
          unpacker.init("R10G10B10A2");
          break;
        case KTX_UNSIGNED_INT_5_9_9_9_REV:
          unpacker.init("R9G9B9A5");
          break;
        default:
          set_last_error("Unsupported KTX packed pixel type");
          return false;
      }

      unpacker.set_pixel_stride(get_ogl_type_size(kt.get_ogl_type()));
    } else {
      switch (kt.get_ogl_fmt()) {
        case 1:
        case KTX_RED:
        case KTX_RED_INTEGER:
        case KTX_R8:
        case KTX_R8UI: {
          unpacker.init("R", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_GREEN:
        case KTX_GREEN_INTEGER: {
          unpacker.init("G", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_BLUE:
        case KTX_BLUE_INTEGER: {
          unpacker.init("B", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_ALPHA: {
          unpacker.init("A", -1, type_bits);
          m_format = PIXEL_FMT_A8;
          break;
        }
        case KTX_LUMINANCE: {
          unpacker.init("Y", -1, type_bits);
          m_format = PIXEL_FMT_L8;
          break;
        }
        case 2:
        case KTX_RG:
        case KTX_RG8:
        case KTX_RG_INTEGER: {
          unpacker.init("RG", -1, type_bits);
          m_format = PIXEL_FMT_A8L8;
          break;
        }
        case KTX_LUMINANCE_ALPHA: {
          unpacker.init("YA", -1, type_bits);
          m_format = PIXEL_FMT_A8L8;
          break;
        }
        case 3:
        case KTX_SRGB:
        case KTX_RGB:
        case KTX_RGB_INTEGER:
        case KTX_RGB8:
        case KTX_SRGB8: {
          unpacker.init("RGB", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_BGR:
        case KTX_BGR_INTEGER: {
          unpacker.init("BGR", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case 4:
        case KTX_RGBA_INTEGER:
        case KTX_RGBA:
        case KTX_SRGB_ALPHA:
        case KTX_SRGB8_ALPHA8:
        case KTX_RGBA8: {
          unpacker.init("RGBA", -1, type_bits);
          break;
        }
        case KTX_BGRA:
        case KTX_BGRA_INTEGER: {
          unpacker.init("BGRA", -1, type_bits);
          break;
        }
        default:
          set_last_error("Unsupported KTX pixel format");
          return false;
      }

      unpacker.set_pixel_stride(unpacker.get_num_comps() * get_ogl_type_size(kt.get_ogl_type()));
    }

    CRNLIB_ASSERT(unpacker.is_valid());
  }

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  m_faces.resize(num_faces);

  bool x_flipped = false;
  bool y_flipped = true;

  dynamic_string orient;
  if ((kt.get_key_value_as_string("KTXorientation", orient)) && (orient.get_len() >= 7)) {
    //  0123456
    // "S=r,T=d"
    if ((orient[0] == 'S') && (orient[1] == '=') && (orient[3] == ',') &&
        (orient[4] == 'T') && (orient[5] == '=')) {
      if (tolower(orient[2]) == 'l')
        x_flipped = true;
      else if (tolower(orient[2]) == 'r')
        x_flipped = false;

      if (tolower(orient[6]) == 'u')
        y_flipped = true;
      else if (tolower(orient[6]) == 'd')
        y_flipped = false;
    }
  }

  orientation_flags_t orient_flags = cDefaultOrientationFlags;
  if (x_flipped)
    orient_flags = static_cast<orientation_flags_t>(orient_flags | cOrientationFlagXFlipped);
  if (y_flipped)
    orient_flags = static_cast<orientation_flags_t>(orient_flags | cOrientationFlagYFlipped);

  bool dxt1_alpha = false;

  for (uint face_index = 0; face_index < num_faces; face_index++) {
    m_faces[face_index].resize(num_mip_levels);

    for (uint level_index = 0; level_index < num_mip_levels; level_index++) {
      const uint width = math::maximum<uint>(m_width >> level_index, 1U);
      const uint height = math::maximum<uint>(m_height >> level_index, 1U);

      mip_level* pMip = crnlib_new<mip_level>();
      m_faces[face_index][level_index] = pMip;

      const crnlib::vector<uint8>& image_data = kt.get_image_data(level_index, 0, face_index, 0);

      if (is_compressed_texture) {
        const uint bytes_per_block = pixel_format_helpers::get_dxt_bytes_per_block(m_format);

        const uint num_blocks_x = (width + 3) >> 2;
        const uint num_blocks_y = (height + 3) >> 2;

        const uint level_pitch = num_blocks_x * num_blocks_y * bytes_per_block;
        if (image_data.size() != level_pitch)
          return false;

        dxt_image* pDXTImage = crnlib_new<dxt_image>();
        if (!pDXTImage->init(dxt_fmt, width, height, false)) {
          crnlib_delete(pDXTImage);

          CRNLIB_ASSERT(0);
          return false;
        }

        CRNLIB_ASSERT(pDXTImage->get_element_vec().size() * sizeof(dxt_image::element) == level_pitch);

        memcpy(&pDXTImage->get_element_vec()[0], image_data.get_ptr(), image_data.size());

        if ((m_format == PIXEL_FMT_DXT1) && (!dxt1_alpha))
          dxt1_alpha = pDXTImage->has_alpha();

        pMip->assign(pDXTImage, m_format, orient_flags);
      } else {
        if (image_data.size() != (width * height * unpacker.get_pixel_stride()))
          return false;

        image_u8* pImage = crnlib_new<image_u8>(width, height);

        pImage->set_comp_flags(m_comp_flags);

        const uint8* pSrc = image_data.get_ptr();

        color_quad_u8 q(0, 0, 0, 255);

        for (uint y = 0; y < height; y++) {
          for (uint x = 0; x < width; x++) {
            color_quad_u8 c;
            pSrc = static_cast<const uint8*>(unpacker.unpack(pSrc, c));
            pImage->set_pixel_unclipped(x, y, c);
          }
        }

        pMip->assign(pImage, m_format, orient_flags);

        CRNLIB_ASSERT(pMip->get_comp_flags() == m_comp_flags);
      }
    }
  }

  clear_last_error();

  if (dxt1_alpha)
    change_dxt1_to_dxt1a();

  return true;
}